

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtrule.cpp
# Opt level: O1

int __thiscall
icu_63::DateTimeRule::clone
          (DateTimeRule *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)UMemory::operator_new((UMemory *)0x28,(size_t)__fn);
  if (puVar1 == (undefined8 *)0x0) {
    puVar1 = (undefined8 *)0x0;
  }
  else {
    *puVar1 = &PTR__DateTimeRule_003a5bc8;
    *(int32_t *)(puVar1 + 1) = this->fMonth;
    *(int32_t *)((long)puVar1 + 0xc) = this->fDayOfMonth;
    *(int32_t *)(puVar1 + 2) = this->fDayOfWeek;
    *(int32_t *)((long)puVar1 + 0x14) = this->fWeekInMonth;
    *(int32_t *)(puVar1 + 3) = this->fMillisInDay;
    *(DateRuleType *)((long)puVar1 + 0x1c) = this->fDateRuleType;
    *(TimeRuleType *)(puVar1 + 4) = this->fTimeRuleType;
  }
  return (int)puVar1;
}

Assistant:

DateTimeRule*
DateTimeRule::clone() const {
    return new DateTimeRule(*this);
}